

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void VisitExpressionTreeNodes
               (ExprBase *expression,void *context,_func_void_void_ptr_ExprBase_ptr *accept)

{
  TypeBase *pTVar1;
  _func_int *p_Var2;
  SynBase *pSVar3;
  ExprBase **ppEVar4;
  uint i;
  uint uVar5;
  TypeBase **ppTVar6;
  _func_int **pp_Var7;
  InplaceStr *pIVar8;
  ExprBase *pEVar9;
  long lStack_40;
  
LAB_0016a80d:
  if (expression == (ExprBase *)0x0) {
    return;
  }
  (*accept)(context,expression);
  lStack_40 = 0x30;
  switch(expression->typeID) {
  case 0:
    for (uVar5 = 0; uVar5 < expression[1].typeID; uVar5 = uVar5 + 1) {
      ppEVar4 = SmallArray<ExprBase_*,_4U>::operator[]
                          ((SmallArray<ExprBase_*,_4U> *)(expression + 1),uVar5);
      VisitExpressionTreeNodes(*ppEVar4,context,accept);
    }
    break;
  default:
    break;
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x16:
  case 0x17:
  case 0x1a:
  case 0x1f:
  case 0x34:
  case 0x35:
    goto switchD_0016a83b_caseD_e;
  case 0xf:
    for (pEVar9 = expression + 1; pEVar9 = (ExprBase *)pEVar9->_vptr_ExprBase,
        pEVar9 != (ExprBase *)0x0; pEVar9 = (ExprBase *)&pEVar9->next) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
    }
    break;
  case 0x14:
  case 0x19:
  case 0x1b:
  case 0x20:
  case 0x31:
  case 0x32:
    VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
  case 0x1e:
  case 0x26:
    lStack_40 = 0x38;
    goto switchD_0016a83b_caseD_e;
  case 0x18:
  case 0x1c:
  case 0x1d:
  case 0x2f:
    VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
    goto LAB_0016a863;
  case 0x21:
    ppEVar4 = (ExprBase **)&expression[1].typeID;
    while (pEVar9 = *ppEVar4, pEVar9 != (ExprBase *)0x0) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
      ppEVar4 = &pEVar9->next;
    }
    break;
  case 0x24:
    VisitExpressionTreeNodes(*(ExprBase **)&expression[1].typeID,context,accept);
    pIVar8 = (InplaceStr *)&expression[1].source;
    while (pSVar3 = (SynBase *)pIVar8->begin, pSVar3 != (SynBase *)0x0) {
      VisitExpressionTreeNodes((ExprBase *)pSVar3,context,accept);
      pIVar8 = &pSVar3->pos;
    }
    VisitExpressionTreeNodes(expression[1].next,context,accept);
    ppEVar4 = (ExprBase **)&expression[1].listed;
    while (pEVar9 = *ppEVar4, pEVar9 != (ExprBase *)0x0) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
      ppEVar4 = &pEVar9->next;
    }
    break;
  case 0x25:
    ppEVar4 = (ExprBase **)&expression[1].typeID;
    while (pEVar9 = *ppEVar4, pEVar9 != (ExprBase *)0x0) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
      ppEVar4 = &pEVar9->next;
    }
    break;
  case 0x27:
    goto switchD_0016a83b_caseD_27;
  case 0x28:
    pEVar9 = expression + 1;
    while (pp_Var7 = pEVar9->_vptr_ExprBase, pp_Var7 != (_func_int **)0x0) {
      VisitExpressionTreeNodes((ExprBase *)pp_Var7[1],context,accept);
      pEVar9 = (ExprBase *)(pp_Var7 + 2);
    }
    break;
  case 0x29:
    VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
    ppEVar4 = (ExprBase **)&expression[1].typeID;
    while (pEVar9 = *ppEVar4, pEVar9 != (ExprBase *)0x0) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
      ppEVar4 = &pEVar9->next;
    }
    break;
  case 0x2c:
    ppEVar4 = (ExprBase **)(expression[1]._vptr_ExprBase + 0x19);
    while (pEVar9 = *ppEVar4, pEVar9 != (ExprBase *)0x0) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
      ppEVar4 = &pEVar9->next;
    }
    break;
  case 0x2d:
    ppTVar6 = &expression[1].type;
    while (pTVar1 = *ppTVar6, pTVar1 != (TypeBase *)0x0) {
      VisitExpressionTreeNodes((ExprBase *)pTVar1,context,accept);
      ppTVar6 = (TypeBase **)&pTVar1->importModule;
    }
    pp_Var7 = expression[1]._vptr_ExprBase + 0xf;
    while (p_Var2 = *pp_Var7, p_Var2 != (_func_int *)0x0) {
      VisitExpressionTreeNodes(*(ExprBase **)(p_Var2 + 8),context,accept);
      pp_Var7 = (_func_int **)(p_Var2 + 0x10);
    }
    break;
  case 0x2e:
    pp_Var7 = expression[1]._vptr_ExprBase + 0xf;
    while (p_Var2 = *pp_Var7, p_Var2 != (_func_int *)0x0) {
      VisitExpressionTreeNodes(*(ExprBase **)(p_Var2 + 8),context,accept);
      pp_Var7 = (_func_int **)(p_Var2 + 0x10);
    }
LAB_0016a863:
    VisitExpressionTreeNodes(*(ExprBase **)&expression[1].typeID,context,accept);
    goto switchD_0016a83b_caseD_27;
  case 0x30:
    VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
    VisitExpressionTreeNodes(*(ExprBase **)&expression[1].typeID,context,accept);
    VisitExpressionTreeNodes((ExprBase *)expression[1].source,context,accept);
    lStack_40 = 0x48;
    goto switchD_0016a83b_caseD_e;
  case 0x33:
    VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
    ppEVar4 = (ExprBase **)&expression[1].typeID;
    while (pEVar9 = *ppEVar4, pEVar9 != (ExprBase *)0x0) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
      ppEVar4 = &pEVar9->next;
    }
    ppTVar6 = &expression[1].type;
    while (pTVar1 = *ppTVar6, pTVar1 != (TypeBase *)0x0) {
      VisitExpressionTreeNodes((ExprBase *)pTVar1,context,accept);
      ppTVar6 = (TypeBase **)&pTVar1->importModule;
    }
    lStack_40 = 0x58;
    goto switchD_0016a83b_caseD_e;
  case 0x36:
    for (pEVar9 = expression + 1; pEVar9 = (ExprBase *)pEVar9->_vptr_ExprBase,
        pEVar9 != (ExprBase *)0x0; pEVar9 = (ExprBase *)&pEVar9->next) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
    }
switchD_0016a83b_caseD_27:
    lStack_40 = 0x40;
switchD_0016a83b_caseD_e:
    expression = *(ExprBase **)((long)&expression->_vptr_ExprBase + lStack_40);
    goto LAB_0016a80d;
  case 0x37:
    for (uVar5 = 0; uVar5 < expression[1].typeID; uVar5 = uVar5 + 1) {
      ppEVar4 = SmallArray<ExprBase_*,_4U>::operator[]
                          ((SmallArray<ExprBase_*,_4U> *)(expression + 1),uVar5);
      VisitExpressionTreeNodes(*ppEVar4,context,accept);
    }
    break;
  case 0x38:
    for (pEVar9 = expression + 7; pEVar9 = (ExprBase *)pEVar9->_vptr_ExprBase,
        pEVar9 != (ExprBase *)0x0; pEVar9 = (ExprBase *)&pEVar9->next) {
      VisitExpressionTreeNodes(pEVar9,context,accept);
    }
    pIVar8 = (InplaceStr *)&expression[7].source;
    while (pSVar3 = (SynBase *)pIVar8->begin, pSVar3 != (SynBase *)0x0) {
      VisitExpressionTreeNodes((ExprBase *)pSVar3,context,accept);
      pIVar8 = &pSVar3->pos;
    }
  }
  return;
}

Assistant:

void VisitExpressionTreeNodes(ExprBase *expression, void *context, void(*accept)(void *context, ExprBase *child))
{
	if(!expression)
		return;

	accept(context, expression);

	if(ExprError *node = getType<ExprError>(expression))
	{
		for(unsigned i = 0; i < node->values.size(); i++)
			VisitExpressionTreeNodes(node->values[i], context, accept);
	}
	else if(ExprPassthrough *node = getType<ExprPassthrough>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprArray *node = getType<ExprArray>(expression))
	{
		for(ExprBase *value = node->values.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprPreModify *node = getType<ExprPreModify>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprPostModify *node = getType<ExprPostModify>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprTypeCast *node = getType<ExprTypeCast>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprUnaryOp *node = getType<ExprUnaryOp>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprBinaryOp *node = getType<ExprBinaryOp>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->rhs, context, accept);
	}
	else if(ExprDereference *node = getType<ExprDereference>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprUnboxing *node = getType<ExprUnboxing>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprConditional *node = getType<ExprConditional>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->trueBlock, context, accept);
		VisitExpressionTreeNodes(node->falseBlock, context, accept);
	}
	else if(ExprAssignment *node = getType<ExprAssignment>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->rhs, context, accept);
	}
	else if(ExprMemberAccess *node = getType<ExprMemberAccess>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprArrayIndex *node = getType<ExprArrayIndex>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
		VisitExpressionTreeNodes(node->index, context, accept);
	}
	else if(ExprReturn *node = getType<ExprReturn>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateUpdate, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprYield *node = getType<ExprYield>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateUpdate, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprVariableDefinition *node = getType<ExprVariableDefinition>(expression))
	{
		VisitExpressionTreeNodes(node->initializer, context, accept);
	}
	else if(ExprZeroInitialize *node = getType<ExprZeroInitialize>(expression))
	{
		VisitExpressionTreeNodes(node->address, context, accept);
	}
	else if(ExprArraySetup *node = getType<ExprArraySetup>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->initializer, context, accept);
	}
	else if(ExprVariableDefinitions *node = getType<ExprVariableDefinitions>(expression))
	{
		for(ExprBase *value = node->definitions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(expression))
	{
		VisitExpressionTreeNodes(node->contextArgument, context, accept);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateRead, context, accept);

		for(ExprBase *expr = node->expressions.head; expr; expr = expr->next)
			VisitExpressionTreeNodes(expr, context, accept);
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(expression))
	{
		for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
			VisitExpressionTreeNodes(expr, context, accept);
	}
	else if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(expression))
	{
		VisitExpressionTreeNodes(node->context, context, accept);
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(expression))
	{
		VisitExpressionTreeNodes(node->context, context, accept);
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(expression))
	{
		for(ShortFunctionHandle *arg = node->functions.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg->context, context, accept);
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(expression))
	{
		VisitExpressionTreeNodes(node->function, context, accept);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg, context, accept);
	}
	else if(ExprGenericClassPrototype *node = getType<ExprGenericClassPrototype>(expression))
	{
		for(ExprBase *value = node->genericProtoType->instances.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprClassDefinition *node = getType<ExprClassDefinition>(expression))
	{
		for(ExprBase *value = node->functions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ConstantData *value = node->classType->constants.head; value; value = value->next)
			VisitExpressionTreeNodes(value->value, context, accept);
	}
	else if(ExprEnumDefinition *node = getType<ExprEnumDefinition>(expression))
	{
		for(ConstantData *value = node->enumType->constants.head; value; value = value->next)
			VisitExpressionTreeNodes(value->value, context, accept);

		VisitExpressionTreeNodes(node->toInt, context, accept);
		VisitExpressionTreeNodes(node->toEnum, context, accept);
	}
	else if(ExprIfElse *node = getType<ExprIfElse>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->trueBlock, context, accept);
		VisitExpressionTreeNodes(node->falseBlock, context, accept);
	}
	else if(ExprFor *node = getType<ExprFor>(expression))
	{
		VisitExpressionTreeNodes(node->initializer, context, accept);
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->increment, context, accept);
		VisitExpressionTreeNodes(node->body, context, accept);
	}
	else if(ExprWhile *node = getType<ExprWhile>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->body, context, accept);
	}
	else if(ExprDoWhile *node = getType<ExprDoWhile>(expression))
	{
		VisitExpressionTreeNodes(node->body, context, accept);
		VisitExpressionTreeNodes(node->condition, context, accept);
	}
	else if(ExprSwitch *node = getType<ExprSwitch>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);

		for(ExprBase *value = node->cases.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ExprBase *value = node->blocks.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		VisitExpressionTreeNodes(node->defaultBlock, context, accept);
	}
	else if(ExprBreak *node = getType<ExprBreak>(expression))
	{
		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprContinue *node = getType<ExprContinue>(expression))
	{
		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprBlock *node = getType<ExprBlock>(expression))
	{
		for(ExprBase *value = node->expressions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprSequence *node = getType<ExprSequence>(expression))
	{
		for(unsigned i = 0; i < node->expressions.size(); i++)
			VisitExpressionTreeNodes(node->expressions[i], context, accept);
	}
	else if(ExprModule *node = getType<ExprModule>(expression))
	{
		for(ExprBase *value = node->setup.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
}